

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  float local_34;
  float local_30;
  float x2;
  float x1;
  float fStack_24;
  uint8_t n;
  int scanf_res;
  float c;
  float b;
  float a;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  c = 0.0;
  scanf_res = 0;
  fStack_24 = 0.0;
  x1 = 0.0;
  _b = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    if (2 < (int)x1) {
      printf("Equation: %fx^2%+fx%+f = 0\n",(double)c,(double)(float)scanf_res,(double)fStack_24);
      solve_quad(c,(float)scanf_res,fStack_24,(uint8_t *)((long)&x2 + 3),&local_30,&local_34);
      if (x2._3_1_ == '\0') {
        printf("No solutions!\n");
      }
      else if (x2._3_1_ == '\x01') {
        printf("%f is the only solution.\n",(double)local_30);
      }
      else if (x2._3_1_ == '\x02') {
        printf("%f and %f are the two solutions to this equation.\n",(double)local_30,
               (double)local_34);
      }
      return argv_local._4_4_;
    }
    printf("Please enter the three quadratic arguments separated by a space: ");
    x1 = (float)__isoc99_scanf("%f %f %f",&c,&scanf_res,&stack0xffffffffffffffdc);
    if (x1 == -NAN) break;
    if (x1 != 4.2039e-45) {
      printf("Invalid input!\n");
      __isoc99_scanf("%*[^\n]");
    }
  }
  printf("\n");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  float a = 0.0, b = 0.0, c = 0.0;
  int scanf_res = 0;
  while (scanf_res < 3) {
    printf("Please enter the three quadratic arguments separated by a space: ");
    scanf_res = scanf("%f %f %f", &a, &b, &c);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res != 3) {
      printf("Invalid input!\n");
      scanf("%*[^\n]");
    }
  }
  uint8_t n;
  float x1, x2;
  printf("Equation: %fx^2%+fx%+f = 0\n", a, b, c);
  solve_quad(a, b, c, &n, &x1, &x2);
  if (n == 0) {
    printf("No solutions!\n");
  } else if (n == 1) {
    printf("%f is the only solution.\n", x1);
  } else if (n == 2) {
    printf("%f and %f are the two solutions to this equation.\n", x1, x2);
  }

  // return 0;
}